

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

int calculate_button_fringe(Am_Widget_Look look,bool leave_room,bool key_sel,bool def)

{
  int iVar1;
  int local_14;
  byte local_f;
  byte local_e;
  int border;
  bool def_local;
  bool key_sel_local;
  bool leave_room_local;
  Am_Widget_Look look_local;
  
  local_f = def;
  local_e = key_sel;
  if (leave_room) {
    local_e = 1;
    local_f = 1;
  }
  if (look.value == Am_MOTIF_LOOK_val) {
    local_14 = 0;
    if ((local_e & 1) != 0) {
      local_14 = 4;
    }
    iVar1 = 0;
    if ((local_f & 1) != 0) {
      iVar1 = 10;
    }
    local_14 = local_14 + iVar1;
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    local_14 = 0;
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    local_14 = 0;
    if ((local_f & 1) != 0) {
      local_14 = 8;
    }
  }
  return local_14;
}

Assistant:

int
calculate_button_fringe(Am_Widget_Look look, bool leave_room, bool key_sel,
                        bool def)
{
  if (leave_room) {
    key_sel = true;
    def = true;
  }

  int border = 0;
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    border = (key_sel ? 2 * kMotKeySel : 0) + (def ? 2 * kMotDefault : 0);
    break;

  case Am_WINDOWS_LOOK_val:
    border = (key_sel ? 2 * kWinKeySel : 0) + (def ? 2 * kWinDefault : 0);
    break;

  case Am_MACINTOSH_LOOK_val:
    border = (key_sel ? 2 * kMacKeySel : 0) + (def ? 2 * kMacDefault : 0);
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  return border;
}